

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

bb_insn_t_conflict get_fake_insn(gen_ctx_t gen_ctx,VARR_bb_insn_t *fake_insns,MIR_reg_t reg)

{
  bb_t_conflict bb;
  MIR_context_t ctx;
  MIR_type_t MVar1;
  ulong uVar2;
  bb_insn_t_conflict *ppbVar3;
  MIR_insn_t_conflict insn;
  bb_insn_t_conflict pbVar4;
  MIR_insn_code_t code;
  ulong unaff_R13;
  size_t sVar5;
  
  bb = (gen_ctx->curr_cfg->bbs).head;
  if (bb->index != 0) {
LAB_00160ea5:
    __assert_fail("bb->index == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x897,"bb_insn_t get_fake_insn(gen_ctx_t, VARR_bb_insn_t *, MIR_reg_t)");
  }
  ctx = gen_ctx->ctx;
  _MIR_new_var_op(ctx,reg);
  if (fake_insns != (VARR_bb_insn_t *)0x0) {
    unaff_R13 = (ulong)reg;
    do {
      if (unaff_R13 < fake_insns->els_num) goto LAB_00160dde;
      if (fake_insns->varr == (bb_insn_t_conflict *)0x0) {
        get_fake_insn_cold_1();
        goto LAB_00160ea5;
      }
      uVar2 = fake_insns->els_num + 1;
      if (fake_insns->size < uVar2) {
        sVar5 = (uVar2 >> 1) + uVar2;
        ppbVar3 = (bb_insn_t_conflict *)realloc(fake_insns->varr,sVar5 * 8);
        fake_insns->varr = ppbVar3;
        fake_insns->size = sVar5;
      }
      sVar5 = fake_insns->els_num;
      fake_insns->els_num = sVar5 + 1;
      fake_insns->varr[sVar5] = (bb_insn_t_conflict)0x0;
    } while (fake_insns != (VARR_bb_insn_t *)0x0);
  }
  get_fake_insn_cold_4();
LAB_00160dde:
  if (fake_insns->varr == (bb_insn_t_conflict *)0x0) {
    get_fake_insn_cold_3();
  }
  else {
    pbVar4 = fake_insns->varr[unaff_R13];
    if (pbVar4 != (bb_insn_t_conflict)0x0) {
      return pbVar4;
    }
    if (reg < 0x22) goto LAB_00160ece;
    MVar1 = MIR_reg_type(ctx,reg - 0x21,(gen_ctx->curr_func_item->u).func);
    if (MVar1 == MIR_T_F) {
      code = MIR_FMOV;
    }
    else if (MVar1 == MIR_T_D) {
      code = MIR_DMOV;
    }
    else {
      code = (uint)(MVar1 == MIR_T_LD) * 3;
    }
    insn = MIR_new_insn(ctx,code);
    pbVar4 = create_bb_insn(gen_ctx,insn,bb);
    if ((fake_insns->varr != (bb_insn_t_conflict *)0x0) && (unaff_R13 < fake_insns->els_num)) {
      fake_insns->varr[unaff_R13] = pbVar4;
      return pbVar4;
    }
  }
  get_fake_insn_cold_2();
LAB_00160ece:
  __assert_fail("reg > ST1_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x89b,"bb_insn_t get_fake_insn(gen_ctx_t, VARR_bb_insn_t *, MIR_reg_t)");
}

Assistant:

static bb_insn_t get_fake_insn (gen_ctx_t gen_ctx, VARR (bb_insn_t) * fake_insns, MIR_reg_t reg) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_type_t type;
  MIR_op_t op;
  MIR_insn_t insn;
  bb_insn_t bb_insn;
  bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); /* enter bb */

  gen_assert (bb->index == 0); /* enter bb */
  op = _MIR_new_var_op (ctx, reg);
  while (VARR_LENGTH (bb_insn_t, fake_insns) <= reg) VARR_PUSH (bb_insn_t, fake_insns, NULL);
  if ((bb_insn = VARR_GET (bb_insn_t, fake_insns, reg)) == NULL) {
    gen_assert (reg > MAX_HARD_REG);
    type = MIR_reg_type (ctx, reg - MAX_HARD_REG, curr_func_item->u.func);
    insn = MIR_new_insn (ctx, get_move_code (type), op, op);
    bb_insn = create_bb_insn (gen_ctx, insn, bb);
    VARR_SET (bb_insn_t, fake_insns, reg, bb_insn);
  }
  return bb_insn;
}